

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32
drwav_preinit_write(drwav *pWav,drwav_data_format *pFormat,drwav_bool32 isSequential,
                   drwav_write_proc onWrite,drwav_seek_proc onSeek,void *pUserData,
                   drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_uint32 dVar1;
  drwav_uint32 dVar2;
  drwav_uint32 dVar3;
  uint uVar4;
  code *pcVar5;
  code *pcVar6;
  drwav_bool32 dVar7;
  drwav_bool32 dVar8;
  void *pvVar9;
  code *pcVar10;
  
  dVar7 = 0;
  dVar8 = 0;
  if ((((onWrite != (drwav_write_proc)0x0 && pWav != (drwav *)0x0) &&
       (dVar8 = dVar7, isSequential != 0 || onSeek != (drwav_seek_proc)0x0)) &&
      (dVar1 = pFormat->format, dVar1 != 2)) && ((dVar1 != 0x11 && (dVar1 != 0xfffe)))) {
    dVar8 = 0;
    memset(pWav,0,0x1b8);
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    if (pAllocationCallbacks == (drwav_allocation_callbacks *)0x0) {
      pcVar10 = drwav__malloc_default;
      pvVar9 = (void *)0x0;
      pcVar6 = drwav__realloc_default;
      pcVar5 = drwav__free_default;
    }
    else {
      pvVar9 = pAllocationCallbacks->pUserData;
      pcVar10 = pAllocationCallbacks->onMalloc;
      pcVar6 = pAllocationCallbacks->onRealloc;
      pcVar5 = pAllocationCallbacks->onFree;
    }
    (pWav->allocationCallbacks).pUserData = pvVar9;
    (pWav->allocationCallbacks).onMalloc = pcVar10;
    (pWav->allocationCallbacks).onRealloc = pcVar6;
    (pWav->allocationCallbacks).onFree = pcVar5;
    if ((pcVar5 != (_func_void_void_ptr_void_ptr *)0x0) &&
       (((pWav->allocationCallbacks).onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0 ||
        ((pWav->allocationCallbacks).onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0))))
    {
      (pWav->fmt).formatTag = (drwav_uint16)pFormat->format;
      dVar1 = pFormat->channels;
      (pWav->fmt).channels = (drwav_uint16)dVar1;
      dVar2 = pFormat->sampleRate;
      (pWav->fmt).sampleRate = dVar2;
      dVar3 = pFormat->bitsPerSample;
      uVar4 = dVar1 * dVar3;
      (pWav->fmt).avgBytesPerSec = dVar2 * uVar4 >> 3;
      (pWav->fmt).blockAlign = (drwav_uint16)(uVar4 >> 3);
      (pWav->fmt).bitsPerSample = (drwav_uint16)dVar3;
      (pWav->fmt).extendedSize = 0;
      pWav->isSequentialWrite = isSequential;
      dVar8 = 1;
    }
  }
  return dVar8;
}

Assistant:

static drwav_bool32 drwav_preinit_write(drwav* pWav, const drwav_data_format* pFormat, drwav_bool32 isSequential, drwav_write_proc onWrite, drwav_seek_proc onSeek, void* pUserData, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onWrite == NULL) {
        return DRWAV_FALSE;
    }

    if (!isSequential && onSeek == NULL) {
        return DRWAV_FALSE; /* <-- onSeek is required when in non-sequential mode. */
    }

    /* Not currently supporting compressed formats. Will need to add support for the "fact" chunk before we enable this. */
    if (pFormat->format == DR_WAVE_FORMAT_EXTENSIBLE) {
        return DRWAV_FALSE;
    }
    if (pFormat->format == DR_WAVE_FORMAT_ADPCM || pFormat->format == DR_WAVE_FORMAT_DVI_ADPCM) {
        return DRWAV_FALSE;
    }

    DRWAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onWrite   = onWrite;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pUserData;
    pWav->allocationCallbacks = drwav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);

    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return DRWAV_FALSE;    /* Invalid allocation callbacks. */
    }

    pWav->fmt.formatTag = (drwav_uint16)pFormat->format;
    pWav->fmt.channels = (drwav_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (drwav_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (drwav_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;

    return DRWAV_TRUE;
}